

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscall.cpp
# Opt level: O0

void sys_open(Process *proc,Args *args)

{
  int64_t iVar1;
  int fd_00;
  uint64_t uVar2;
  uint uStack_90;
  int fd;
  uint64_t flags;
  string local_78;
  path local_58;
  undefined1 local_38 [8];
  path path;
  Args *args_local;
  Process *proc_local;
  
  iVar1 = args->PID;
  path.m_pathname.field_2._8_8_ = args;
  uVar2 = Args::operator[](args,0);
  ReadString_abi_cxx11_(&local_78,(pid_t)iVar1,uVar2);
  boost::filesystem::path::path(&local_58,&local_78);
  Process::Normalise((path *)local_38,proc,&local_58);
  boost::filesystem::path::~path(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  uVar2 = Args::operator[]((Args *)path.m_pathname.field_2._8_8_,1);
  fd_00 = (int)*(undefined8 *)(path.m_pathname.field_2._8_8_ + 8);
  if (-1 < *(long *)(path.m_pathname.field_2._8_8_ + 8)) {
    Process::MapFd(proc,fd_00,(path *)local_38);
    uStack_90 = (uint)uVar2;
    Process::SetCloseExec(proc,fd_00,(bool)((byte)(uStack_90 >> 0x13) & 1));
  }
  boost::filesystem::path::~path((path *)local_38);
  return;
}

Assistant:

static void sys_open(Process *proc, const Args &args)
{
  const fs::path path = proc->Normalise(ReadString(args.PID, args[0]));
  const uint64_t flags = args[1];
  const int fd = args.Return;

  if (args.Return >= 0) {
    proc->MapFd(fd, path);
    proc->SetCloseExec(fd, flags & O_CLOEXEC);
  }
}